

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O2

void monster_swap(loc grid1,loc grid2)

{
  uint32_t *puVar1;
  byte *pbVar2;
  ulong uVar3;
  ulong uVar4;
  short sVar5;
  short sVar6;
  loc grid1_00;
  player_upkeep *ppVar7;
  loc grid2_00;
  player *ppVar8;
  _Bool _Var9;
  monster_conflict *pmVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  loc lVar13;
  
  grid1_00.x = (player->grid).x;
  grid1_00.y = (player->grid).y;
  wVar12 = grid1.x;
  sVar5 = cave->squares[(long)grid1 >> 0x20][wVar12].mon;
  wVar11 = grid2.x;
  sVar6 = cave->squares[(long)grid2 >> 0x20][wVar11].mon;
  square_set_mon(cave,grid1,(int)sVar6);
  square_set_mon(cave,grid2,(int)sVar5);
  ppVar8 = player;
  if (sVar5 < 1) {
    if (sVar5 < 0) {
      (player->grid).x = wVar11;
      (ppVar8->grid).y = grid2.y;
      lVar13.x = (ppVar8->grid).x;
      lVar13.y = (ppVar8->grid).y;
      player_leaving(grid1_00,lVar13);
      ppVar7 = player->upkeep;
      uVar3._0_4_ = ppVar7->update;
      uVar3._4_4_ = ppVar7->redraw;
      ppVar7->update = (int)(uVar3 | 0x40400000000340);
      ppVar7->redraw = (int)((uVar3 | 0x40400000000340) >> 0x20);
      cmd_disable_repeat_floor_item();
    }
  }
  else {
    pmVar10 = (monster_conflict *)cave_monster(cave,(int)sVar5);
    _Var9 = monster_is_camouflaged((monster *)pmVar10);
    if (_Var9) {
      _Var9 = monster_is_in_view((monster *)pmVar10);
      if (!_Var9) {
        lVar13 = grid1;
        if (-1 < sVar6) {
          lVar13 = grid1_00;
        }
        _Var9 = los(cave,(loc_conflict)lVar13,(loc_conflict)grid2);
        if (!_Var9) {
          _Var9 = monster_is_mimicking((monster *)pmVar10);
          if (_Var9) {
            move_mimicked_object((chunk *)cave,pmVar10,grid1,grid2);
            puVar1 = &player->upkeep->redraw;
            *puVar1 = *puVar1 | 0x800000;
          }
          goto LAB_0017ee2e;
        }
      }
      become_aware((chunk *)cave,pmVar10);
    }
LAB_0017ee2e:
    (pmVar10->grid).x = wVar11;
    (pmVar10->grid).y = grid2.y;
    update_mon(pmVar10,(chunk *)cave,true);
    ppVar7 = player->upkeep;
    if (pmVar10->race->light != L'\0') {
      puVar1 = &ppVar7->update;
      *(byte *)puVar1 = (byte)*puVar1 | 0xc0;
    }
    pbVar2 = (byte *)((long)&ppVar7->redraw + 2);
    *pbVar2 = *pbVar2 | 0x40;
  }
  ppVar8 = player;
  if (sVar6 < 1) {
    if (sVar6 < 0) {
      (player->grid).x = wVar12;
      (ppVar8->grid).y = grid1.y;
      grid2_00.x = (ppVar8->grid).x;
      grid2_00.y = (ppVar8->grid).y;
      player_leaving(grid1_00,grid2_00);
      ppVar7 = player->upkeep;
      uVar4._0_4_ = ppVar7->update;
      uVar4._4_4_ = ppVar7->redraw;
      ppVar7->update = (int)(uVar4 | 0x40400000000340);
      ppVar7->redraw = (int)((uVar4 | 0x40400000000340) >> 0x20);
      cmd_disable_repeat_floor_item();
    }
    goto LAB_0017efbb;
  }
  pmVar10 = (monster_conflict *)cave_monster(cave,(int)sVar6);
  _Var9 = monster_is_camouflaged((monster *)pmVar10);
  if (_Var9) {
    _Var9 = monster_is_in_view((monster *)pmVar10);
    if (!_Var9) {
      lVar13 = grid2;
      if (-1 < sVar5) {
        lVar13 = grid1_00;
      }
      _Var9 = los(cave,(loc_conflict)lVar13,(loc_conflict)grid1);
      if (!_Var9) {
        _Var9 = monster_is_mimicking((monster *)pmVar10);
        if (_Var9) {
          move_mimicked_object((chunk *)cave,pmVar10,grid2,grid1);
          puVar1 = &player->upkeep->redraw;
          *puVar1 = *puVar1 | 0x800000;
        }
        goto LAB_0017ef80;
      }
    }
    become_aware((chunk *)cave,pmVar10);
  }
LAB_0017ef80:
  (pmVar10->grid).x = wVar12;
  (pmVar10->grid).y = grid1.y;
  update_mon(pmVar10,(chunk *)cave,true);
  ppVar7 = player->upkeep;
  if (pmVar10->race->light != L'\0') {
    puVar1 = &ppVar7->update;
    *(byte *)puVar1 = (byte)*puVar1 | 0xc0;
  }
  pbVar2 = (byte *)((long)&ppVar7->redraw + 2);
  *pbVar2 = *pbVar2 | 0x40;
LAB_0017efbb:
  square_light_spot((chunk *)cave,grid1);
  square_light_spot((chunk *)cave,grid2);
  return;
}

Assistant:

void monster_swap(struct loc grid1, struct loc grid2)
{
	int m1, m2;
	struct monster *mon;
	struct loc pgrid = player->grid;

	/* Monsters */
	m1 = cave->squares[grid1.y][grid1.x].mon;
	m2 = cave->squares[grid2.y][grid2.x].mon;

	/* Update grids */
	square_set_mon(cave, grid1, m2);
	square_set_mon(cave, grid2, m1);

	/* Monster 1 */
	if (m1 > 0) {
		/* Monster */
		mon = cave_monster(cave, m1);

		/* Update monster */
		if (monster_is_camouflaged(mon)) {
			/*
			 * Become aware if the player can see the grid with
			 * the camouflaged monster before or after the swap.
			 */
			if (monster_is_in_view(mon) ||
				(m2 >= 0 && los(cave, pgrid, grid2)) ||
				(m2 < 0 && los(cave, grid1, grid2))) {
				become_aware(cave, mon);
			} else if (monster_is_mimicking(mon)) {
				move_mimicked_object(cave, mon, grid1, grid2);
				player->upkeep->redraw |= (PR_ITEMLIST);
			}
		}
		mon->grid = grid2;
		update_mon(mon, cave, true);

		/* Affect light? */
		if (mon->race->light != 0)
			player->upkeep->update |= PU_UPDATE_VIEW | PU_MONSTERS;

		/* Redraw monster list */
		player->upkeep->redraw |= (PR_MONLIST);
	} else if (m1 < 0) {
		/* Player */
		player->grid = grid2;
		player_leaving(pgrid, player->grid);

		/* Update the trap detection status */
		player->upkeep->redraw |= (PR_DTRAP);

		/* Updates */
		player->upkeep->update |= (PU_PANEL | PU_UPDATE_VIEW | PU_DISTANCE);

		/* Redraw monster list */
		player->upkeep->redraw |= (PR_MONLIST);

		/* Don't allow command repeat if moved away from item used. */
		cmd_disable_repeat_floor_item();
	}

	/* Monster 2 */
	if (m2 > 0) {
		/* Monster */
		mon = cave_monster(cave, m2);

		/* Update monster */
		if (monster_is_camouflaged(mon)) {
			/*
			 * Become aware if the player can see the grid with
			 * the camouflaged monster before or after the swap.
			 */
			if (monster_is_in_view(mon) ||
				(m1 >= 0 && los(cave, pgrid, grid1)) ||
				(m1 < 0 && los(cave, grid2, grid1))) {
				become_aware(cave, mon);
			} else if (monster_is_mimicking(mon)) {
				move_mimicked_object(cave, mon, grid2, grid1);
				player->upkeep->redraw |= (PR_ITEMLIST);
			}
		}
		mon->grid = grid1;
		update_mon(mon, cave, true);

		/* Affect light? */
		if (mon->race->light != 0)
			player->upkeep->update |= PU_UPDATE_VIEW | PU_MONSTERS;

		/* Redraw monster list */
		player->upkeep->redraw |= (PR_MONLIST);
	} else if (m2 < 0) {
		/* Player */
		player->grid = grid1;
		player_leaving(pgrid, player->grid);

		/* Update the trap detection status */
		player->upkeep->redraw |= (PR_DTRAP);

		/* Updates */
		player->upkeep->update |= (PU_PANEL | PU_UPDATE_VIEW | PU_DISTANCE);

		/* Redraw monster list */
		player->upkeep->redraw |= (PR_MONLIST);

		/* Don't allow command repeat if moved away from item used. */
		cmd_disable_repeat_floor_item();
	}

	/* Redraw */
	square_light_spot(cave, grid1);
	square_light_spot(cave, grid2);
}